

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.cpp
# Opt level: O0

void __thiscall axl::io::ShmtBase::closeImpl(ShmtBase *this)

{
  int in_ESI;
  long in_RDI;
  
  File::close((File *)(in_RDI + 4),in_ESI);
  sys::NamedSemaphore::close((NamedSemaphore *)(in_RDI + 0x60),in_ESI);
  sys::NamedSemaphore::close((NamedSemaphore *)(in_RDI + 0x68),in_ESI);
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  return;
}

Assistant:

void
ShmtBase::closeImpl() {
	m_file.close();
	m_readSemaphore.close();
	m_writeSemaphore.close();
	m_hdr = NULL;
	m_data = NULL;
}